

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall Net::closing(Net *this)

{
  string request;
  allocator local_51;
  string local_50;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,"CLOSE",&local_51);
  std::__cxx11::string::string((string *)&local_50,local_30);
  send_with_retry(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  BIO_ctrl((BIO *)this->sock,0x8e,0,(void *)0x0);
  this->closed = 1;
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Net::closing(){
	std::string request="CLOSE";
	send_with_retry(request);
	BIO_shutdown_wr(sock);
	closed=1;
}